

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

ArrayPtr<const_char> * __thiscall
kj::Vector<kj::ArrayPtr<char_const>>::add<kj::StringPtr&>
          (Vector<kj::ArrayPtr<char_const>> *this,StringPtr *params)

{
  bool bVar1;
  StringPtr *params_00;
  ArrayPtr<const_char> *pAVar2;
  StringPtr *params_local;
  Vector<kj::ArrayPtr<const_char>_> *this_local;
  
  bVar1 = ArrayBuilder<kj::ArrayPtr<const_char>_>::isFull
                    ((ArrayBuilder<kj::ArrayPtr<const_char>_> *)this);
  if (bVar1) {
    Vector<kj::ArrayPtr<const_char>_>::grow((Vector<kj::ArrayPtr<const_char>_> *)this,0);
  }
  params_00 = fwd<kj::StringPtr&>(params);
  pAVar2 = ArrayBuilder<kj::ArrayPtr<char_const>>::add<kj::StringPtr&>
                     ((ArrayBuilder<kj::ArrayPtr<char_const>> *)this,params_00);
  return pAVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }